

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.cpp
# Opt level: O0

Result<wasm::Ok> * __thiscall
wasm::IRBuilder::makeAtomicRMW
          (Result<wasm::Ok> *__return_storage_ptr__,IRBuilder *this,AtomicRMWOp op,uint bytes,
          Address offset,Type type,Name mem)

{
  __index_type *this_00;
  AtomicRMW *expr;
  bool bVar1;
  Ok local_f9;
  size_t local_f8;
  char *local_f0;
  uintptr_t local_e8;
  address64_t local_e0;
  uint local_d4;
  Err local_d0;
  Err *local_a0;
  Err *err;
  Result<wasm::Ok> _val;
  AtomicRMW curr;
  uint bytes_local;
  AtomicRMWOp op_local;
  IRBuilder *this_local;
  Type type_local;
  Address offset_local;
  
  this_00 = &_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>
             .super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_index;
  curr.memory.super_IString.str._M_str._0_4_ = bytes;
  curr.memory.super_IString.str._M_str._4_4_ = op;
  AtomicRMW::AtomicRMW((AtomicRMW *)this_00);
  wasm::Name::operator=((Name *)&curr.value,&mem);
  curr.super_SpecificExpression<(wasm::Expression::Id)24>.super_Expression._0_8_ = type.id;
  UnifiedExpressionVisitor<wasm::IRBuilder,_wasm::Result<wasm::Ok>_>::visitAtomicRMW
            ((Result<wasm::Ok> *)&err,
             (UnifiedExpressionVisitor<wasm::IRBuilder,_wasm::Result<wasm::Ok>_> *)this,
             (AtomicRMW *)this_00);
  local_a0 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)&err);
  bVar1 = local_a0 != (Err *)0x0;
  if (bVar1) {
    wasm::Err::Err(&local_d0,local_a0);
    Result<wasm::Ok>::Result(__return_storage_ptr__,&local_d0);
    wasm::Err::~Err(&local_d0);
  }
  local_d4 = (uint)bVar1;
  Result<wasm::Ok>::~Result((Result<wasm::Ok> *)&err);
  if (local_d4 == 0) {
    local_f8 = mem.super_IString.str._M_len;
    local_f0 = mem.super_IString.str._M_str;
    local_e8 = type.id;
    local_e0 = offset.addr;
    expr = Builder::makeAtomicRMW
                     (&this->builder,curr.memory.super_IString.str._M_str._4_4_,
                      (uint)curr.memory.super_IString.str._M_str,offset,
                      (Expression *)curr.offset.addr,curr.ptr,type,mem);
    push(this,(Expression *)expr);
    Result<wasm::Ok>::Result<wasm::Ok>(__return_storage_ptr__,&local_f9);
  }
  return __return_storage_ptr__;
}

Assistant:

Result<> IRBuilder::makeAtomicRMW(
  AtomicRMWOp op, unsigned bytes, Address offset, Type type, Name mem) {
  AtomicRMW curr;
  curr.memory = mem;
  curr.type = type;
  CHECK_ERR(visitAtomicRMW(&curr));
  push(
    builder.makeAtomicRMW(op, bytes, offset, curr.ptr, curr.value, type, mem));
  return Ok{};
}